

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_utils.c
# Opt level: O0

int mk_utils_worker_spawn(_func_void_void_ptr *func,void *arg,pthread_t *tid)

{
  int iVar1;
  undefined1 local_60 [8];
  pthread_attr_t thread_attr;
  pthread_t *tid_local;
  void *arg_local;
  _func_void_void_ptr *func_local;
  
  thread_attr._48_8_ = tid;
  tid_local = (pthread_t *)arg;
  arg_local = func;
  pthread_attr_init((pthread_attr_t *)local_60);
  pthread_attr_setdetachstate((pthread_attr_t *)local_60,0);
  iVar1 = pthread_create((pthread_t *)thread_attr._48_8_,(pthread_attr_t *)local_60,
                         (__start_routine *)arg_local,tid_local);
  if (iVar1 < 0) {
    mk_utils_libc_error("pthread_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_core/mk_utils.c"
                        ,0x11d);
    func_local._4_4_ = -1;
  }
  else {
    func_local._4_4_ = 0;
  }
  return func_local._4_4_;
}

Assistant:

int mk_utils_worker_spawn(void (*func) (void *), void *arg, pthread_t *tid)
{
    pthread_attr_t thread_attr;

    pthread_attr_init(&thread_attr);
    pthread_attr_setdetachstate(&thread_attr, PTHREAD_CREATE_JOINABLE);
    if (pthread_create(tid, &thread_attr, (void *) func, arg) < 0) {
        mk_libc_error("pthread_create");
        return -1;
    }

    return 0;
}